

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_TestPSSBadParameters_Test::~X509Test_TestPSSBadParameters_Test
          (X509Test_TestPSSBadParameters_Test *this)

{
  X509Test_TestPSSBadParameters_Test *this_local;
  
  ~X509Test_TestPSSBadParameters_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(X509Test, TestPSSBadParameters) {
  bssl::UniquePtr<X509> cert(CertFromPEM(kBadPSSCertPEM));
  ASSERT_TRUE(cert);

  bssl::UniquePtr<EVP_PKEY> pkey(X509_get_pubkey(cert.get()));
  ASSERT_TRUE(pkey);

  ASSERT_FALSE(X509_verify(cert.get(), pkey.get()));
  ERR_clear_error();
}